

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O0

bool verona::resolve_typename(Lookup *p,Node *n)

{
  Node *pNVar1;
  bool bVar2;
  element_type *peVar3;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *this_00;
  Location *loc;
  size_type sVar4;
  reference psVar5;
  Node *pNVar6;
  Token local_170;
  WFLookup local_168;
  shared_ptr<trieste::NodeDef> local_148;
  Token local_138;
  Token local_130;
  initializer_list<trieste::Token> local_128;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_118;
  shared_ptr<trieste::NodeDef> local_110;
  Lookup local_100;
  undefined1 local_b8 [8];
  Nodes defs;
  Token local_90;
  undefined1 local_88 [8];
  WFLookup id;
  undefined1 local_60 [8];
  Node def;
  Token TStack_48;
  Token TStack_40;
  Token TStack_38;
  initializer_list<trieste::Token> local_30;
  Node *local_20;
  Node *n_local;
  Lookup *p_local;
  
  local_20 = n;
  n_local = &p->def;
  peVar3 = ::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)n);
  trieste::Token::Token
            ((Token *)&def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(TokenDef *)TypeClassName);
  trieste::Token::Token(&TStack_48,(TokenDef *)TypeAliasName);
  trieste::Token::Token(&TStack_40,(TokenDef *)TypeParamName);
  trieste::Token::Token(&TStack_38,(TokenDef *)TypeTraitName);
  local_30._M_array =
       (iterator)&def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_30._M_len = 4;
  bVar2 = trieste::NodeDef::in(peVar3,&local_30);
  if (bVar2) {
    ::std::shared_ptr<trieste::NodeDef>::shared_ptr
              ((shared_ptr<trieste::NodeDef> *)local_60,n_local);
    bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar2) {
      trieste::Token::Token(&local_90,(TokenDef *)Ident);
      trieste::operator/((WFLookup *)local_88,n,&local_90);
      peVar3 = ::std::
               __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      this = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             trieste::wf::detail::WFLookup::operator->((WFLookup *)local_88);
      this_00 = ::std::
                __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this);
      loc = trieste::NodeDef::location(this_00);
      trieste::NodeDef::lookdown((Nodes *)local_b8,peVar3,loc);
      sVar4 = ::std::
              vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ::size((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      *)local_b8);
      pNVar1 = n_local;
      if (sVar4 == 1) {
        local_118._M_current =
             (shared_ptr<trieste::NodeDef> *)
             ::std::
             vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ::begin((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      *)local_b8);
        psVar5 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                 ::operator*(&local_118);
        ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_110,psVar5);
        Lookup::make(&local_100,(Lookup *)pNVar1,&local_110);
        Lookup::operator=((Lookup *)n_local,&local_100);
        Lookup::~Lookup(&local_100);
        ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_110);
        peVar3 = ::std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)n);
        trieste::Token::Token(&local_138,(TokenDef *)TypeClassName);
        trieste::Token::Token(&local_130,(TokenDef *)TypeAliasName);
        local_128._M_array = &local_138;
        local_128._M_len = 2;
        bVar2 = trieste::NodeDef::in(peVar3,&local_128);
        pNVar1 = n_local;
        if (bVar2) {
          trieste::Token::Token(&local_170,(TokenDef *)TypeArgs);
          trieste::operator/(&local_168,n,&local_170);
          pNVar6 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_168);
          ::std::shared_ptr<trieste::NodeDef>::shared_ptr(&local_148,pNVar6);
          apply_typeargs((Lookup *)pNVar1,&local_148);
          ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_148);
          trieste::wf::detail::WFLookup::~WFLookup(&local_168);
        }
        p_local._7_1_ = 1;
      }
      else {
        p_local._7_1_ = 0;
      }
      id.index._4_4_ = 1;
      ::std::
      vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ::~vector((vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 *)local_b8);
      trieste::wf::detail::WFLookup::~WFLookup((WFLookup *)local_88);
    }
    else {
      p_local._7_1_ = 0;
      id.index._4_4_ = 1;
    }
    ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_60);
    return (bool)(p_local._7_1_ & 1);
  }
  __assert_fail("n->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName})",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                ,0x109,"bool verona::resolve_typename(Lookup &, Node)");
}

Assistant:

static bool resolve_typename(Lookup& p, Node n)
  {
    assert(n->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}));
    auto def = p.def;

    if (!def)
      return false;

    auto id = n / Ident;
    auto defs = def->lookdown(id->location());

    if (defs.size() != 1)
      return false;

    p = p.make(*defs.begin());

    if (n->in({TypeClassName, TypeAliasName}))
      apply_typeargs(p, n / TypeArgs);

    return true;
  }